

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cComputeShaderTests.cpp
# Opt level: O2

bool __thiscall
glcts::anon_unknown_0::BasicOneWorkGroup::RunIteration
          (BasicOneWorkGroup *this,int param_1,int param_2,int param_3,GLuint binding,
          bool dispatch_indirect)

{
  CallLogWrapper *this_00;
  GLuint *buffers;
  bool bVar1;
  GLuint GVar2;
  ostream *poVar3;
  void *pvVar4;
  bool *compile_error;
  ulong uVar5;
  uint uVar6;
  long lVar7;
  int x;
  ulong uVar8;
  int y;
  uint uVar9;
  Vector<unsigned_int,_4> local_200;
  ulong local_1f0;
  long local_1e8;
  ulong local_1e0;
  GLuint num_groups [3];
  GLint v [3];
  ostream local_1a8;
  
  if (this->m_program != 0) {
    glu::CallLogWrapper::glDeleteProgram
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,this->m_program);
  }
  std::__cxx11::stringstream::stringstream((stringstream *)v);
  poVar3 = std::operator<<(&local_1a8,"\nlayout(local_size_x = ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,param_1);
  poVar3 = std::operator<<(poVar3,", local_size_y = ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,param_2);
  poVar3 = std::operator<<(poVar3,", local_size_z = ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,param_3);
  poVar3 = std::operator<<(poVar3,") in;\nlayout(std430, binding = ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  poVar3 = std::operator<<(poVar3,
                           ") buffer Output {\n  uvec4 local_id[];\n} g_out;\nvoid main() {\n  if (gl_WorkGroupSize == uvec3("
                          );
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,param_1);
  poVar3 = std::operator<<(poVar3,", ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,param_2);
  poVar3 = std::operator<<(poVar3,", ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,param_3);
  std::operator<<(poVar3,
                  ") && gl_WorkGroupID == uvec3(0) &&\n      gl_GlobalInvocationID == gl_LocalInvocationID) {\n    g_out.local_id[gl_LocalInvocationIndex] = uvec4(gl_LocalInvocationID, 0);\n  } else {\n    g_out.local_id[gl_LocalInvocationIndex] = uvec4(0xffff);\n  }\n}"
                 );
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)v);
  GVar2 = ComputeShaderBase::CreateComputeProgram
                    (&this->super_ComputeShaderBase,(string *)num_groups);
  this->m_program = GVar2;
  std::__cxx11::string::~string((string *)num_groups);
  this_00 = &(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glLinkProgram(this_00,this->m_program);
  bVar1 = ComputeShaderBase::CheckProgram
                    (&this->super_ComputeShaderBase,this->m_program,compile_error);
  if (bVar1) {
    glu::CallLogWrapper::glGetProgramiv(this_00,this->m_program,0x8267,v);
    if (v[2] == param_3 && (v[1] == param_2 && v[0] == param_1)) {
      local_1f0 = (ulong)(uint)(param_2 * param_1);
      buffers = &this->m_storage_buffer;
      GVar2 = this->m_storage_buffer;
      if (GVar2 == 0) {
        glu::CallLogWrapper::glGenBuffers(this_00,1,buffers);
        GVar2 = *buffers;
      }
      glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,binding,GVar2);
      lVar7 = (ulong)(uint)(param_2 * param_1 * param_3) << 4;
      glu::CallLogWrapper::glBufferData(this_00,0x90d2,lVar7,(void *)0x0,0x88e8);
      glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,0);
      glu::CallLogWrapper::glUseProgram(this_00,this->m_program);
      if (dispatch_indirect) {
        num_groups._0_8_ = &DAT_100000001;
        num_groups[2] = 1;
        GVar2 = this->m_dispatch_buffer;
        if (GVar2 == 0) {
          glu::CallLogWrapper::glGenBuffers(this_00,1,&this->m_dispatch_buffer);
          GVar2 = this->m_dispatch_buffer;
        }
        glu::CallLogWrapper::glBindBuffer(this_00,0x90ee,GVar2);
        glu::CallLogWrapper::glBufferData(this_00,0x90ee,0xc,num_groups,0x88e4);
        glu::CallLogWrapper::glDispatchComputeIndirect(this_00,0);
      }
      else {
        glu::CallLogWrapper::glDispatchCompute(this_00,1,1,1);
      }
      glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,*buffers);
      glu::CallLogWrapper::glMemoryBarrier(this_00,0x200);
      pvVar4 = glu::CallLogWrapper::glMapBufferRange(this_00,0x90d2,0,lVar7,1);
      uVar5 = 0;
      if (0 < param_1) {
        uVar5 = (ulong)(uint)param_1;
      }
      if (param_2 < 1) {
        param_2 = 0;
      }
      if (param_3 < 1) {
        param_3 = 0;
      }
      local_1e0 = (ulong)(uint)param_1;
      lVar7 = 0;
      bVar1 = true;
      for (uVar6 = 0; uVar6 != param_3; uVar6 = uVar6 + 1) {
        local_1e8 = lVar7;
        for (uVar9 = 0; uVar9 != param_2; uVar9 = uVar9 + 1) {
          for (uVar8 = 0; uVar5 != uVar8; uVar8 = uVar8 + 1) {
            tcu::Vector<unsigned_int,_4>::Vector
                      (&local_200,
                       (Vector<unsigned_int,_4> *)((long)(int)(lVar7 + uVar8) * 0x10 + (long)pvVar4)
                      );
            if ((((uVar8 != local_200.m_data[0]) || (local_200.m_data[1] != uVar9)) ||
                (local_200.m_data[2] != uVar6)) || (local_200.m_data[3] != 0)) {
              bVar1 = false;
              anon_unknown_0::Output("Invalid data at offset %d.\n",lVar7 + uVar8 & 0xffffffff);
            }
          }
          lVar7 = lVar7 + local_1e0;
        }
        lVar7 = local_1e8 + local_1f0;
      }
      glu::CallLogWrapper::glUnmapBuffer(this_00,0x90d2);
      glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,0);
    }
    else {
      bVar1 = false;
      anon_unknown_0::Output("GL_COMPUTE_LOCAL_WORK_SIZE is (%d %d %d) should be (%d %d %d)\n");
    }
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool RunIteration(int local_size_x, int local_size_y, int local_size_z, GLuint binding, bool dispatch_indirect)
	{
		if (m_program != 0)
			glDeleteProgram(m_program);
		m_program = CreateComputeProgram(GenSource(local_size_x, local_size_y, local_size_z, binding));
		glLinkProgram(m_program);
		if (!CheckProgram(m_program))
			return false;

		GLint v[3];
		glGetProgramiv(m_program, GL_COMPUTE_WORK_GROUP_SIZE, v);
		if (v[0] != local_size_x || v[1] != local_size_y || v[2] != local_size_z)
		{
			Output("GL_COMPUTE_LOCAL_WORK_SIZE is (%d %d %d) should be (%d %d %d)\n", v[0], v[1], v[2], local_size_x,
				   local_size_y, local_size_z);
			return false;
		}

		const int kSize = local_size_x * local_size_y * local_size_z;

		if (m_storage_buffer == 0)
			glGenBuffers(1, &m_storage_buffer);
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, binding, m_storage_buffer);
		glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(uvec4) * kSize, NULL, GL_DYNAMIC_DRAW);
		glBindBuffer(GL_SHADER_STORAGE_BUFFER, 0);

		glUseProgram(m_program);
		if (dispatch_indirect)
		{
			const GLuint num_groups[3] = { 1, 1, 1 };
			if (m_dispatch_buffer == 0)
				glGenBuffers(1, &m_dispatch_buffer);
			glBindBuffer(GL_DISPATCH_INDIRECT_BUFFER, m_dispatch_buffer);
			glBufferData(GL_DISPATCH_INDIRECT_BUFFER, sizeof(num_groups), num_groups, GL_STATIC_DRAW);
			glDispatchComputeIndirect(0);
		}
		else
		{
			glDispatchCompute(1, 1, 1);
		}

		uvec4* data;
		glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_storage_buffer);
		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);
		data =
			static_cast<uvec4*>(glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, kSize * sizeof(uvec4), GL_MAP_READ_BIT));

		bool ret = true;
		for (int z = 0; z < local_size_z; ++z)
		{
			for (int y = 0; y < local_size_y; ++y)
			{
				for (int x = 0; x < local_size_x; ++x)
				{
					const int index = z * local_size_x * local_size_y + y * local_size_x + x;
					if (!IsEqual(data[index], uvec4(x, y, z, 0)))
					{
						Output("Invalid data at offset %d.\n", index);
						ret = false;
					}
				}
			}
		}
		glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);
		glBindBuffer(GL_SHADER_STORAGE_BUFFER, 0);
		return ret;
	}